

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall CVmConsole::read_line_from_script(CVmConsole *this,char *buf,size_t buflen,int *evt)

{
  int iVar1;
  CVmConsole *in_RCX;
  osfildef *in_RDI;
  int c;
  osfildef *fp;
  osfildef *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  FILE *__stream;
  
  if (in_RDI->_IO_write_base != (char *)0x0) {
    __stream = *(FILE **)(in_RDI->_IO_write_base + 0x10);
    while( true ) {
      while (*(int *)(in_RDI->_IO_write_base + 0x24) != 0) {
        iVar1 = read_script_event_type((CVmConsole *)buflen,evt,(unsigned_long *)fp);
        if (iVar1 == 0) {
          return 0;
        }
        if ((*(uint *)&in_RCX->_vptr_CVmConsole | 4) == 6) {
          iVar1 = read_script_param(in_RCX,(char *)__stream,
                                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                    in_RDI);
          return iVar1;
        }
        skip_script_line((CVmConsole *)in_RDI,in_stack_ffffffffffffffb8);
      }
      in_stack_ffffffffffffffcc = fgetc(__stream);
      if (in_stack_ffffffffffffffcc == 0x3e) {
        *(undefined4 *)&in_RCX->_vptr_CVmConsole = 6;
        iVar1 = read_script_param(in_RCX,(char *)__stream,CONCAT44(0x3e,in_stack_ffffffffffffffc8),
                                  in_RDI);
        return iVar1;
      }
      if (in_stack_ffffffffffffffcc == -1) break;
      if ((in_stack_ffffffffffffffcc != 10) && (in_stack_ffffffffffffffcc != 0xd)) {
        skip_script_line((CVmConsole *)in_RDI,in_stack_ffffffffffffffb8);
      }
    }
  }
  return 0;
}

Assistant:

int CVmConsole::read_line_from_script(char *buf, size_t buflen, int *evt)
{
    /* if there's no script file, return failure */
    if (script_sp_ == 0)
        return FALSE;

    /* get the file from the script stack */
    osfildef *fp = script_sp_->fp;

    /* keep going until we find a line that we like */
    for (;;)
    {
        /* read the script according to its type ('event' or 'line input') */
        if (script_sp_->event_script)
        {
            /* read to the next event */
            if (!read_script_event_type(evt, 0))
                return FALSE;

            /* check the event code */
            switch (*evt)
            {
            case OS_EVT_LINE:
            case OS_EVT_TIMEOUT:
                /* 
                 *   it's one of our line input events - read the line (or
                 *   partial line, in the case of TIMEOUT) 
                 */
                return read_script_param(buf, buflen, fp);

            default:
                /* 
                 *   it's not our type of event - skip the rest of the line
                 *   and keep looking 
                 */
                skip_script_line(fp);
                break;
            }
        }
        else
        {
            /* 
             *   We have a basic line-input script rather than an event
             *   script.  Each input line starts with a '>'; everything else
             *   is a comment.
             *   
             *   Read the first character on the line.  If it's not a
             *   newline, there's more text on the same line, so read the
             *   rest and determine what to do.  
             */
            int c = osfgetc(fp);
            if (c == '>')
            {
                /* it's a command line - read it */
                *evt = OS_EVT_LINE;
                return read_script_param(buf, buflen, fp);
            }
            else if (c == EOF)
            {
                /* end of file */
                return FALSE;
            }
            else if (c == '\n' || c == '\r')
            {
                /* blank line - continue on to the next line */
            }
            else
            {
                /* it's not a command line - just skip it and keep looking */
                skip_script_line(fp);
            }
        }
    }
}